

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

int rhash_file_update(rhash ctx,FILE *fd)

{
  int iVar1;
  int *piVar2;
  void *__ptr;
  size_t length_00;
  int local_44;
  int res;
  size_t length;
  uchar *buffer;
  size_t block_size;
  rhash_context_ext *ectx;
  FILE *fd_local;
  rhash ctx_local;
  
  local_44 = 0;
  if (ctx[1].hash_id == 0xb01dbabe) {
    if (ctx == (rhash)0x0) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      ctx_local._4_4_ = -1;
    }
    else {
      __ptr = (void *)aligned_alloc(0x40,0x2000);
      if (__ptr == (void *)0x0) {
        ctx_local._4_4_ = -1;
      }
      else {
        while( true ) {
          iVar1 = feof((FILE *)fd);
          if ((iVar1 != 0) || (ctx[1].hash_id != 0xb01dbabe)) goto LAB_00e7e920;
          length_00 = fread(__ptr,1,0x2000,(FILE *)fd);
          iVar1 = ferror((FILE *)fd);
          if (iVar1 != 0) break;
          if ((length_00 != 0) && (rhash_update(ctx,__ptr,length_00), ctx[2].msg_size != 0)) {
            (*(code *)ctx[2].msg_size)(*(undefined8 *)&ctx[2].hash_id,ctx->msg_size);
          }
        }
        local_44 = -1;
LAB_00e7e920:
        free(__ptr);
        ctx_local._4_4_ = local_44;
      }
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

RHASH_API int rhash_file_update(rhash ctx, FILE* fd)
{
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	const size_t block_size = 8192;
	unsigned char* buffer;
	size_t length = 0;
	int res = 0;
	if (ectx->state != STATE_ACTIVE)
		return 0; /* do nothing if canceled */
	if (ctx == NULL) {
		errno = EINVAL;
		return -1;
	}
	buffer = (unsigned char*)rhash_aligned_alloc(DEFAULT_ALIGNMENT, block_size);
	if (!buffer)
		return -1; /* errno is set to ENOMEM according to UNIX 98 */

	while (!feof(fd)) {
		if (ectx->state != STATE_ACTIVE)
			break; /* stop if canceled */
		length = fread(buffer, 1, block_size, fd);

		if (ferror(fd)) {
			res = -1; /* note: errno contains error code */
			break;
		} else if (length) {
			rhash_update(ctx, buffer, length);

			if (ectx->callback) {
				((rhash_callback_t)ectx->callback)(ectx->callback_data, ectx->rc.msg_size);
			}
		}
	}
	rhash_aligned_free(buffer);
	return res;
}